

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

int ext_opsize(int ext,int pos)

{
  return *(int *)(&DAT_00b8b4a4 + ((uint)ext >> 8 & 0x1c));
}

Assistant:

static inline int ext_opsize(int ext, int pos)
{
    switch ((ext >> pos) & 7) {
    case 0: return OS_LONG;
    case 1: return OS_SINGLE;
    case 2: return OS_EXTENDED;
    case 3: return OS_PACKED;
    case 4: return OS_WORD;
    case 5: return OS_DOUBLE;
    case 6: return OS_BYTE;
    default:
        // g_assert_not_reached();
        return 0;
    }
}